

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O0

void __thiscall
ConfidentialAssetId_GetCommitment_Test::ConfidentialAssetId_GetCommitment_Test
          (ConfidentialAssetId_GetCommitment_Test *this)

{
  ConfidentialAssetId_GetCommitment_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialAssetId_GetCommitment_Test_00894110;
  return;
}

Assistant:

TEST(ConfidentialAssetId, GetCommitment) {
  ConfidentialAssetId asset(
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  BlindFactor abf(
      "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3");
  ConfidentialAssetId commitment = ConfidentialAssetId::GetCommitment(
      asset, abf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
}